

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptPromiseCapabilitiesExecutorFunction * __thiscall
Js::JavascriptLibrary::CreatePromiseCapabilitiesExecutorFunction
          (JavascriptLibrary *this,JavascriptMethod entryPoint,
          JavascriptPromiseCapability *capability)

{
  ScriptContext *scriptContext;
  DynamicObject *prototype;
  JavascriptPromiseCapability *entryPoint_00;
  ScriptContext **ppSVar1;
  DynamicObject **ppDVar2;
  DynamicTypeHandler *typeHandler;
  Recycler *pRVar3;
  JavascriptPromiseCapabilitiesExecutorFunction *this_00;
  Var pvVar4;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_61;
  TrackAllocData local_60;
  JavascriptPromiseCapabilitiesExecutorFunction *local_38;
  JavascriptPromiseCapabilitiesExecutorFunction *function;
  DynamicType *type;
  FunctionInfo *functionInfo;
  JavascriptPromiseCapability *capability_local;
  JavascriptMethod entryPoint_local;
  JavascriptLibrary *this_local;
  
  type = (DynamicType *)JavascriptPromise::EntryInfo::CapabilitiesExecutorFunction;
  functionInfo = (FunctionInfo *)capability;
  capability_local = (JavascriptPromiseCapability *)entryPoint;
  entryPoint_local = (JavascriptMethod)this;
  ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  scriptContext = *ppSVar1;
  ppDVar2 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).functionPrototype);
  entryPoint_00 = capability_local;
  prototype = *ppDVar2;
  typeHandler = GetDeferredAnonymousFunctionTypeHandler(this);
  function = (JavascriptPromiseCapabilitiesExecutorFunction *)
             DynamicType::New(scriptContext,TypeIds_Function,&prototype->super_RecyclableObject,
                              (JavascriptMethod)entryPoint_00,typeHandler,false,false);
  pRVar3 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_60,(type_info *)&JavascriptPromiseCapabilitiesExecutorFunction::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x19d7);
  pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_60);
  this_00 = (JavascriptPromiseCapabilitiesExecutorFunction *)
            new<(Memory::ObjectInfoBits)1>(0x48,pRVar3,&local_61);
  JavascriptPromiseCapabilitiesExecutorFunction::JavascriptPromiseCapabilitiesExecutorFunction
            (this_00,(DynamicType *)function,(FunctionInfo *)type,
             (JavascriptPromiseCapability *)functionInfo);
  local_38 = this_00;
  pvVar4 = TaggedInt::ToVarUnchecked(2);
  (*(this_00->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(this_00,0xd1,pvVar4,2,0,0,0xf);
  return local_38;
}

Assistant:

JavascriptPromiseCapabilitiesExecutorFunction* JavascriptLibrary::CreatePromiseCapabilitiesExecutorFunction(JavascriptMethod entryPoint, JavascriptPromiseCapability* capability)
    {
        FunctionInfo* functionInfo = &Js::JavascriptPromise::EntryInfo::CapabilitiesExecutorFunction;
        DynamicType* type = DynamicType::New(scriptContext, TypeIds_Function, functionPrototype, entryPoint, GetDeferredAnonymousFunctionTypeHandler());
        JavascriptPromiseCapabilitiesExecutorFunction* function = RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, JavascriptPromiseCapabilitiesExecutorFunction, type, functionInfo, capability);

        function->SetPropertyWithAttributes(PropertyIds::length, TaggedInt::ToVarUnchecked(2), PropertyConfigurable, nullptr);

        return function;
    }